

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::~IfcLightSourceGoniometric
          (IfcLightSourceGoniometric *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  LazyObject *pLVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  this[-1].LightDistributionDataSource.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(vtable + 0x18);
  (this->LightEmissionSource).field_2._M_allocated_capacity = 0x86b9f8;
  *(undefined8 *)&this[-1].field_0xf0 = 0x86b980;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x86b9a8;
  (this->super_IfcLightSource).AmbientIntensity.ptr = 4.36229926086554e-317;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->LightEmissionSource)._M_string_length;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pLVar1 = (this->ColourAppearance).ptr.obj;
  if (pLVar1 != (LazyObject *)&this->ColourTemperature) {
    operator_delete(pLVar1,(long)this->ColourTemperature + 1);
  }
  this[-1].LightDistributionDataSource.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (IfcLightSource-in-Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::construction_vtable
          + 0x18);
  (this->LightEmissionSource).field_2._M_allocated_capacity = 0x86bb48;
  *(undefined8 *)&this[-1].field_0xf0 = 0x86baf8;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x86bb20;
  puVar2 = *(undefined1 **)
            &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
  puVar3 = &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
            super_IfcRepresentationItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].LightDistributionDataSource.
                   super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,0x100);
  return;
}

Assistant:

IfcLightSourceGoniometric() : Object("IfcLightSourceGoniometric") {}